

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_modifier(lysp_yin_ctx *ctx,void *parent,char **pat,lysp_ext_instance **exts)

{
  char *pcVar1;
  LY_ERR LVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  ly_ctx *ctx_00;
  char *temp_val;
  yin_subelement subelems [1];
  
  subelems[0].flags = 0;
  subelems[0]._18_6_ = 0;
  subelems[0].type = LY_STMT_EXTENSION_INSTANCE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  if (**pat == '\x06') {
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&temp_val,Y_STR_ARG,LY_STMT_MODIFIER),
       pcVar1 = temp_val, LVar2 == LY_SUCCESS)) {
      iVar3 = strcmp(temp_val,"invert-match");
      if (iVar3 == 0) {
        lydict_remove(ctx->xmlctx->ctx,pcVar1);
        pcVar1 = *pat;
        sVar4 = strlen(pcVar1);
        __dest = (char *)malloc(sVar4 + 1);
        if (__dest == (char *)0x0) {
          LVar2 = LY_EMEM;
          ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "yin_parse_modifier");
        }
        else {
          strcpy(__dest,pcVar1);
          lydict_remove(ctx->xmlctx->ctx,pcVar1);
          *__dest = '\x15';
          LVar2 = lydict_insert_zc(ctx->xmlctx->ctx,__dest,pat);
          if (LVar2 == LY_SUCCESS) {
            LVar2 = yin_parse_content(ctx,subelems,1,parent,LY_STMT_MODIFIER,(char **)0x0,exts);
          }
        }
      }
      else {
        if (ctx == (lysp_yin_ctx *)0x0) {
          ctx_00 = (ly_ctx *)0x0;
        }
        else {
          ctx_00 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_YIN,
                "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Only valid value is \"%s\"."
                ,pcVar1,"value","modifier","invert-match");
        lydict_remove(ctx->xmlctx->ctx,temp_val);
        LVar2 = LY_EVALID;
      }
    }
    return LVar2;
  }
  __assert_fail("**pat == 0x06",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                ,0x3c1,
                "LY_ERR yin_parse_modifier(struct lysp_yin_ctx *, const void *, const char **, struct lysp_ext_instance **)"
               );
}

Assistant:

static LY_ERR
yin_parse_modifier(struct lysp_yin_ctx *ctx, const void *parent, const char **pat, struct lysp_ext_instance **exts)
{
    const char *temp_val;
    char *modified_val;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    assert(**pat == 0x06);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_MODIFIER));
    if (strcmp(temp_val, "invert-match") != 0) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS1, temp_val, "value",
                "modifier", "invert-match");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    /* allocate new value */
    modified_val = malloc(strlen(*pat) + 1);
    LY_CHECK_ERR_RET(!modified_val, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
    strcpy(modified_val, *pat);
    lydict_remove(ctx->xmlctx->ctx, *pat);

    /* modify the new value */
    modified_val[0] = LYSP_RESTR_PATTERN_NACK;
    LY_CHECK_RET(lydict_insert_zc(ctx->xmlctx->ctx, modified_val, pat));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_MODIFIER, NULL, exts));

    return LY_SUCCESS;
}